

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_WAVEPACKET14_v4::read
          (LASreadItemCompressed_WAVEPACKET14_v4 *this,int __fd,void *__buf,size_t __nbytes)

{
  U32 UVar1;
  I32 IVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  undefined1 local_68 [8];
  LASwavepacket13 last_item_m;
  LASwavepacket13 this_item_m;
  U8 *last_item;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_WAVEPACKET14_v4 *this_local;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  this_item_m._24_8_ = this->contexts[this->current_context].last_item;
  if (this->current_context != *__buf) {
    this->current_context = *__buf;
    if ((this->contexts[this->current_context].unused & 1U) != 0) {
      createAndInitModelsAndDecompressors(this,this->current_context,(U8 *)this_item_m._24_8_);
    }
    this_item_m._24_8_ = this->contexts[this->current_context].last_item;
  }
  if ((this->changed_wavepacket & 1U) != 0) {
    UVar1 = ArithmeticDecoder::decodeSymbol
                      (this->dec_wavepacket,this->contexts[this->current_context].m_packet_index);
    *(char *)puVar3 = (char)UVar1;
    LASwavepacket13::unpack((LASwavepacket13 *)local_68,(U8 *)(this_item_m._24_8_ + 1));
    UVar1 = ArithmeticDecoder::decodeSymbol
                      (this->dec_wavepacket,
                       this->contexts[this->current_context].m_offset_diff
                       [this->contexts[this->current_context].sym_last_offset_diff]);
    this->contexts[this->current_context].sym_last_offset_diff = UVar1;
    if (this->contexts[this->current_context].sym_last_offset_diff == 0) {
      last_item_m._24_8_ = local_68;
    }
    else if (this->contexts[this->current_context].sym_last_offset_diff == 1) {
      last_item_m._24_8_ = (long)local_68 + (ulong)(uint)last_item_m.offset;
    }
    else if (this->contexts[this->current_context].sym_last_offset_diff == 2) {
      IVar2 = IntegerCompressor::decompress
                        (this->contexts[this->current_context].ic_offset_diff,
                         this->contexts[this->current_context].last_diff_32,0);
      this->contexts[this->current_context].last_diff_32 = IVar2;
      last_item_m._24_8_ = (long)local_68 + (long)this->contexts[this->current_context].last_diff_32
      ;
    }
    else {
      last_item_m._24_8_ = ArithmeticDecoder::readInt64(this->dec_wavepacket);
    }
    IntegerCompressor::decompress
              (this->contexts[this->current_context].ic_packet_size,(uint)last_item_m.offset,0);
    IntegerCompressor::decompress
              (this->contexts[this->current_context].ic_return_point,last_item_m.offset._4_4_,0);
    IntegerCompressor::decompress
              (this->contexts[this->current_context].ic_xyz,last_item_m.packet_size,0);
    IntegerCompressor::decompress
              (this->contexts[this->current_context].ic_xyz,last_item_m.return_point.i32,1);
    IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,last_item_m.x.i32,2);
    LASwavepacket13::pack((LASwavepacket13 *)&last_item_m.z,(U8 *)((long)puVar3 + 1));
    *(undefined8 *)this_item_m._24_8_ = *puVar3;
    *(undefined8 *)(this_item_m._24_8_ + 8) = puVar3[1];
    *(undefined8 *)(this_item_m._24_8_ + 0x10) = puVar3[2];
    *(undefined4 *)(this_item_m._24_8_ + 0x18) = *(undefined4 *)(puVar3 + 3);
    *(undefined1 *)(this_item_m._24_8_ + 0x1c) = *(undefined1 *)((long)puVar3 + 0x1c);
    this = (LASreadItemCompressed_WAVEPACKET14_v4 *)this_item_m._24_8_;
  }
  return (ssize_t)this;
}

Assistant:

inline void LASreadItemCompressed_WAVEPACKET14_v4::read(U8* item, U32& context)
{
  // get last

  U8* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 reader
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndDecompressors(current_context, last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // decompress

  if (changed_wavepacket)
  {
    item[0] = (U8)(dec_wavepacket->decodeSymbol(contexts[current_context].m_packet_index));

    LASwavepacket13 this_item_m;
    LASwavepacket13 last_item_m = LASwavepacket13::unpack(last_item+1);

    contexts[current_context].sym_last_offset_diff = dec_wavepacket->decodeSymbol(contexts[current_context].m_offset_diff[contexts[current_context].sym_last_offset_diff]);

    if (contexts[current_context].sym_last_offset_diff == 0)
    {
      this_item_m.offset = last_item_m.offset;
    }
    else if (contexts[current_context].sym_last_offset_diff == 1)
    {
      this_item_m.offset = last_item_m.offset + last_item_m.packet_size;
    }
    else if (contexts[current_context].sym_last_offset_diff == 2)
    {
      contexts[current_context].last_diff_32 = contexts[current_context].ic_offset_diff->decompress(contexts[current_context].last_diff_32);
      this_item_m.offset = last_item_m.offset + contexts[current_context].last_diff_32;
    }
    else
    {
      this_item_m.offset = dec_wavepacket->readInt64();
    }

    this_item_m.packet_size = contexts[current_context].ic_packet_size->decompress(last_item_m.packet_size);
    this_item_m.return_point.i32 = contexts[current_context].ic_return_point->decompress(last_item_m.return_point.i32);
    this_item_m.x.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.x.i32, 0);
    this_item_m.y.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.y.i32, 1);
    this_item_m.z.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.z.i32, 2);

    this_item_m.pack(item+1);

    memcpy(last_item, item, 29);
  }
}